

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

void Extra_ThreshSimplifyInequalities
               (int nInequalities,int nChows,unsigned_long **pGreaters,unsigned_long **pSmallers)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  unsigned_long *puVar9;
  
  if (0 < nInequalities) {
    uVar6 = 0;
    do {
      if (0 < nChows) {
        puVar1 = pGreaters[uVar6];
        puVar2 = pSmallers[uVar6];
        lVar7 = 0;
        lVar5 = 0;
        do {
          uVar3 = *(ulong *)((long)puVar1 + lVar7);
          puVar9 = (unsigned_long *)((long)puVar2 + lVar7);
          uVar4 = *(ulong *)((long)puVar2 + lVar7);
          lVar8 = uVar3 - uVar4;
          if (lVar8 == 0) {
            *(undefined8 *)((long)puVar1 + lVar7) = 0;
          }
          else if (uVar3 < uVar4 || lVar8 == 0) {
            *puVar9 = uVar4 - uVar3;
            puVar9 = puVar1 + lVar5;
          }
          else {
            *(long *)((long)puVar1 + lVar7) = lVar8;
          }
          *puVar9 = 0;
          lVar5 = lVar5 + 1;
          lVar7 = lVar7 + 8;
        } while ((ulong)(uint)nChows << 3 != lVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nInequalities);
  }
  return;
}

Assistant:

void Extra_ThreshSimplifyInequalities(int nInequalities, int nChows,
        unsigned long ** pGreaters, unsigned long ** pSmallers) {
    int i = 0, k = 0;

    for (k = 0; k < nInequalities; k++) {
        for (i = 0; i < nChows; i++) {
            if ((pGreaters[k][i]) == (pSmallers[k][i])) {
                pGreaters[k][i] = 0;
                pSmallers[k][i] = 0;
            } else if ((pGreaters[k][i]) > (pSmallers[k][i])) {
                pGreaters[k][i] = pGreaters[k][i] - pSmallers[k][i];
                pSmallers[k][i] = 0;
            } else {
                pSmallers[k][i] = pSmallers[k][i] - pGreaters[k][i];
                ;
                pGreaters[k][i] = 0;
            }
        }
    }
//        Extra_ThreshPrintInequalities( pGreaters, pSmallers, nChows, nInequalities);
//        printf( "\nInequalities was Siplified \n");
}